

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::StaticInitializerVisitor::visit<slang::ast::TaggedUnionExpression>
          (StaticInitializerVisitor *this,TaggedUnionExpression *expr)

{
  ExpressionKind EVar1;
  SymbolKind SVar2;
  SystemSubroutine *pSVar3;
  Expression *pEVar4;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar5;
  pointer ppFVar6;
  optional<bool> oVar7;
  int iVar8;
  Symbol *pSVar9;
  Expression *pEVar10;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar11;
  Diagnostic *this_00;
  Diagnostic *this_01;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar12;
  SourceLocation SVar13;
  DiagCode code;
  ASTContext *this_02;
  Expression *pEVar15;
  VariableSymbol *var;
  bool bVar16;
  SourceRange sourceRange;
  SourceLocation SVar14;
  
  EVar1 = (expr->super_Expression).kind;
  if (EVar1 - NamedValue < 2) {
    pSVar9 = Expression::getSymbolReference(&expr->super_Expression,true);
    if (pSVar9 != (Symbol *)0x0) {
      SVar2 = pSVar9->kind;
      if ((SVar2 == ModportPort) || (SVar2 == Net)) {
        this_02 = this->context;
        SVar14 = (expr->super_Expression).sourceRange.startLoc;
        SVar13 = (expr->super_Expression).sourceRange.endLoc;
        code.subsystem = Declarations;
        code.code = 0xf8;
LAB_00417528:
        sourceRange.endLoc = SVar13;
        sourceRange.startLoc = SVar14;
        this_00 = ASTContext::addDiag(this_02,code,sourceRange);
        this_01 = Diagnostic::operator<<(this_00,this->sourceVar->name);
        Diagnostic::operator<<(this_01,pSVar9->name);
        Diagnostic::addNote(this_00,(DiagCode)0x50001,pSVar9->location);
        return;
      }
      if ((SVar2 == Variable) && (pSVar9 != this->sourceVar)) {
        pEVar10 = DeclaredType::getInitializer((DeclaredType *)(pSVar9 + 1));
        bVar16 = pSVar9[5].name._M_len != 0;
        oVar7 = Symbol::isDeclaredBefore(pSVar9,this->sourceVar);
        if ((bVar16 || pEVar10 == (Expression *)0x0) ||
           ((((ushort)oVar7.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 0x100) == 0 ||
            (((ushort)oVar7.super__Optional_base<bool,_true,_true>._M_payload.
                      super__Optional_payload_base<bool> & 1) == 0)))) {
          code = (DiagCode)((uint)(bVar16 || pEVar10 == (Expression *)0x0) * 0x10000 + 0xf70006);
          this_02 = this->context;
          SVar14 = (expr->super_Expression).sourceRange.startLoc;
          SVar13 = (expr->super_Expression).sourceRange.endLoc;
          goto LAB_00417528;
        }
      }
    }
  }
  else if (EVar1 == Call) {
    CallExpression::visitExprsNoArgs<slang::ast::StaticInitializerVisitor&>
              ((CallExpression *)expr,this);
    if (*(char *)&expr[1].super_Expression.sourceRange.startLoc == '\x01') {
      pvVar11 = std::
                get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                          ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            *)&expr->member);
      pEVar10 = expr[1].valueExpr;
      if (pEVar10 != (Expression *)0x0) {
        pSVar3 = (pvVar11->subroutine).ptr;
        pSVar9 = expr[1].member;
        pEVar15 = (Expression *)0x0;
        do {
          iVar8 = (*pSVar3->_vptr_SystemSubroutine[4])(pSVar3,pEVar15);
          if ((char)iVar8 == '\0') {
            pEVar4 = *(Expression **)(&pSVar9->kind + (long)pEVar15 * 2);
            Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::StaticInitializerVisitor&>
                      (pEVar4,pEVar4,this);
          }
          pEVar15 = (Expression *)((long)&pEVar15->kind + 1);
        } while (pEVar10 != pEVar15);
      }
    }
    else {
      ppSVar12 = std::
                 get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)&expr->member);
      pSVar5 = *ppSVar12;
      if ((pSVar5->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pSVar5->super_Scope);
      }
      pEVar10 = expr[1].valueExpr;
      if (pEVar10 != (Expression *)0x0) {
        ppFVar6 = (pSVar5->arguments)._M_ptr;
        pSVar9 = expr[1].member;
        pEVar15 = (Expression *)0x0;
        do {
          if (ppFVar6[(long)pEVar15]->direction == In) {
            pEVar4 = *(Expression **)(&pSVar9->kind + (long)pEVar15 * 2);
            Expression::
            visitExpression<slang::ast::Expression_const,slang::ast::StaticInitializerVisitor&>
                      (pEVar4,pEVar4,this);
          }
          pEVar15 = (Expression *)((long)&pEVar15->kind + 1);
        } while (pEVar10 != pEVar15);
      }
    }
  }
  else if ((EVar1 != NewCovergroup) && (pEVar10 = expr->valueExpr, pEVar10 != (Expression *)0x0)) {
    Expression::visitExpression<slang::ast::Expression_const,slang::ast::StaticInitializerVisitor&>
              (pEVar10,pEVar10,this);
    return;
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (sym->kind == SymbolKind::Variable) {
                            // Don't warn if this is the same var.
                            auto& var = sym->template as<VariableSymbol>();
                            if (&var == &sourceVar)
                                return;

                            const bool hasInit = var.getInitializer();
                            const bool isFromPort = var.getFirstPortBackref();
                            const bool isDeclaredBefore = var.isDeclaredBefore(sourceVar).value_or(
                                false);

                            // We warn unless this var has an initializer, is declared
                            // before us in the same instance, and isn't attached to a port.
                            if (hasInit && !isFromPort && isDeclaredBefore)
                                return;

                            auto code = (hasInit && !isFromPort) ? diag::StaticInitOrder
                                                                 : diag::StaticInitValue;
                            auto& diag = context.addDiag(code, expr.sourceRange);
                            diag << sourceVar.name << var.name;
                            diag.addNote(diag::NoteDeclarationHere, var.location);
                        }
                        else if (sym->kind == SymbolKind::Net ||
                                 sym->kind == SymbolKind::ModportPort) {
                            auto& diag = context.addDiag(diag::StaticInitValue, expr.sourceRange);
                            diag << sourceVar.name << sym->name;
                            diag.addNote(diag::NoteDeclarationHere, sym->location);
                        }
                    }
                    break;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    call.visitExprsNoArgs(*this);

                    if (call.isSystemCall()) {
                        // Ignore unevaluated arguments to system calls.
                        auto& sub = *std::get<1>(call.subroutine).subroutine;
                        auto args = call.arguments();
                        for (size_t i = 0; i < args.size(); i++) {
                            if (!sub.isArgUnevaluated(i))
                                args[i]->visit(*this);
                        }
                    }
                    else {
                        // Skip over output, inout, and ref args.
                        auto& sub = *std::get<0>(call.subroutine);
                        auto formals = sub.getArguments();
                        auto args = call.arguments();
                        SLANG_ASSERT(formals.size() == args.size());
                        for (size_t i = 0; i < args.size(); i++) {
                            if (formals[i]->direction == ArgumentDirection::In)
                                args[i]->visit(*this);
                        }
                    }
                    break;
                }
                case ExpressionKind::NewCovergroup:
                    // Ignore new covergroup expressions.
                    break;
                default:
                    if constexpr (HasVisitExprs<T, StaticInitializerVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }